

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

int xmlListPushBack(xmlListPtr l,void *data)

{
  _xmlLink *p_Var1;
  xmlGenericErrorFunc p_Var2;
  _xmlLink *p_Var3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  int iVar6;
  
  if (l == (xmlListPtr)0x0) {
    iVar6 = 0;
  }
  else {
    p_Var1 = l->sentinel->prev;
    p_Var3 = (_xmlLink *)(*xmlMalloc)(0x18);
    if (p_Var3 == (_xmlLink *)0x0) {
      pp_Var4 = __xmlGenericError();
      p_Var2 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      iVar6 = 0;
      (*p_Var2)(*ppvVar5,"Cannot initialize memory for new link");
    }
    else {
      p_Var3->data = data;
      p_Var3->next = p_Var1->next;
      p_Var1->next->prev = p_Var3;
      p_Var1->next = p_Var3;
      p_Var3->prev = p_Var1;
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

int
xmlListPushBack(xmlListPtr l, void *data)
{
    xmlLinkPtr lkPlace, lkNew;

    if (l == NULL)
        return(0);
    lkPlace = l->sentinel->prev;
    /* Add the new link */
    if (NULL ==(lkNew = (xmlLinkPtr )xmlMalloc(sizeof(xmlLink)))) {
        xmlGenericError(xmlGenericErrorContext,
		        "Cannot initialize memory for new link");
        return (0);
    }
    lkNew->data = data;
    lkNew->next = lkPlace->next;
    (lkPlace->next)->prev = lkNew;
    lkPlace->next = lkNew;
    lkNew->prev = lkPlace;
    return 1;
}